

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fd_filter.cc
# Opt level: O2

void __thiscall
sptk::reaper::FdFilter::ComplexDotProduct
          (FdFilter *this,int n,float *r1,float *i1,float *r2,float *i2,float *r3,float *i3)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  long lVar5;
  
  if (i2 == (float *)0x0) {
    for (lVar5 = 0; n != (int)lVar5; lVar5 = lVar5 + 1) {
      fVar1 = r2[lVar5];
      fVar2 = r1[lVar5];
      i3[lVar5] = fVar1 * i1[lVar5];
      r3[lVar5] = fVar2 * fVar1;
    }
  }
  else {
    for (lVar5 = 0; n != (int)lVar5; lVar5 = lVar5 + 1) {
      fVar1 = r1[lVar5];
      fVar2 = r2[lVar5];
      fVar3 = i1[lVar5];
      fVar4 = i2[lVar5];
      i3[lVar5] = fVar1 * fVar4 + fVar2 * fVar3;
      r3[lVar5] = fVar1 * fVar2 - fVar4 * fVar3;
    }
  }
  return;
}

Assistant:

void FdFilter::ComplexDotProduct(int n, float *r1, float *i1, float *r2,
                                 float *i2, float *r3, float *i3) {
  float tr1, ti1;

  /* This full complex multiply is only necessary for non-symmetric kernels */
  if (i2) {  // Only supply the i2 vector if you need to do a full
            // complex multiply.
    while (n--) {
      tr1 = (*r1 * *r2) - (*i1 * *i2);
      ti1 = (*r1++ * *i2++) + (*r2++ * *i1++);
      *i3++ = ti1;
      *r3++ = tr1;
    }
  } else {
    /* Can do this iff the filter is symmetric, zero phase.  */
    while (n--) {
      tr1 = (*r1++ * *r2);
      ti1 = (*r2++ * *i1++);
      *i3++ = ti1;
      *r3++ = tr1;
    }
  }
}